

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O3

PCAPNG_RESULT
pcapng_create(PCAPNG_HANDLE *handle,char *filename,option_header *section_options,
             size_t section_options_space,uint16_t link_type,uint32_t snaplen,
             option_header *interface_options,size_t interface_options_space)

{
  uint16_t uVar1;
  ushort uVar2;
  option_header *poVar3;
  int iVar4;
  int __fd;
  ssize_t sVar5;
  size_t sVar6;
  section_header_block *psVar7;
  interface_description_block *piVar8;
  uint32_t uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  PCAPNG_RESULT PVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined8 local_60;
  interface_description_block idb;
  
  iVar4 = getpagesize();
  handle->section_header = (section_header_block *)0x0;
  handle->section_header_size = 0;
  handle->next_section_option_offset = 0;
  handle->interface_description = (interface_description_block *)0x0;
  handle->interface_description_size = 0;
  handle->next_interface_option_offset = 0;
  __fd = open(filename,0xc2,0x1b0);
  handle->fd = __fd;
  PVar13 = PCAPNG_FILE_WRITE_ERROR;
  if (__fd == -1) goto LAB_00108087;
  handle->section_header_size = 0x18;
  sVar5 = write(__fd,&DAT_0010c530,0x18);
  if (section_options == (option_header *)0x0 || sVar5 == -1) {
    sVar6 = handle->section_header_size;
    handle->next_section_option_offset = sVar6;
    if (sVar5 != -1) goto LAB_00107f0a;
  }
  else {
    uVar1 = section_options->option_code;
    while (idb._8_8_ = section_options_space, uVar1 != 0) {
      uVar2 = section_options->option_length;
      if (uVar2 == 0) break;
      uVar10 = (ulong)(uVar2 + 3 & 0xfffffffc);
      sVar5 = write(handle->fd,section_options,(ulong)uVar2 + 4);
      if (sVar5 != -1 && uVar10 != uVar2) {
        lVar15 = uVar2 - uVar10;
        do {
          lVar15 = lVar15 + 1;
          sVar5 = write(handle->fd,"",1);
          if (lVar15 == 0) break;
        } while (sVar5 != -1);
      }
      sVar6 = handle->section_header_size + uVar10 + 4;
      handle->section_header_size = sVar6;
      if (sVar5 == -1) {
        handle->next_section_option_offset = sVar6;
        goto LAB_00108081;
      }
      poVar3 = section_options + 1;
      section_options = (option_header *)((long)&section_options[1].option_code + uVar10);
      section_options_space = idb._8_8_;
      uVar1 = *(uint16_t *)((long)&poVar3->option_code + uVar10);
    }
    sVar6 = handle->section_header_size;
    handle->next_section_option_offset = sVar6;
LAB_00107f0a:
    uVar12 = (ulong)iVar4;
    uVar10 = sVar6 + section_options_space + uVar12 + 3;
    sVar11 = uVar10 - uVar10 % uVar12;
    handle->section_header_size = sVar11;
    lVar15 = sVar11 - sVar6;
    if (lVar15 != 0) {
      do {
        sVar5 = write(handle->fd,"",1);
        lVar15 = lVar15 + -1;
        if (lVar15 == 0) break;
      } while (sVar5 != -1);
      sVar11 = handle->section_header_size;
    }
    psVar7 = (section_header_block *)mmap((void *)0x0,sVar11,3,1,handle->fd,0);
    handle->section_header = psVar7;
    if (sVar5 != -1) {
      if (psVar7 == (section_header_block *)0xffffffffffffffff) {
        PVar13 = PCAPNG_MMAP_FAILED;
        goto LAB_00108087;
      }
      local_60 = 1;
      idb.block_type._2_2_ = 0;
      handle->interface_description_size = 0x10;
      idb.block_type._0_2_ = link_type;
      idb.block_total_length = snaplen;
      sVar5 = write(handle->fd,&local_60,0x10);
      if (interface_options == (option_header *)0x0 || sVar5 == -1) {
        sVar6 = handle->interface_description_size;
        handle->next_interface_option_offset = sVar6;
        PVar13 = PCAPNG_FILE_WRITE_ERROR;
        if (sVar5 != -1) {
LAB_001080af:
          PVar13 = PCAPNG_FILE_WRITE_ERROR;
          uVar10 = sVar6 + uVar12 + interface_options_space + 3;
          bVar16 = false;
          sVar11 = uVar10 - uVar10 % uVar12;
          handle->interface_description_size = sVar11;
          lVar15 = sVar11 - sVar6;
          if (lVar15 != 0) {
            do {
              sVar5 = write(handle->fd,"",1);
              lVar15 = lVar15 + -1;
              if (lVar15 == 0) break;
            } while (sVar5 != -1);
            sVar11 = handle->interface_description_size;
            bVar16 = sVar5 == -1;
          }
          piVar8 = (interface_description_block *)
                   mmap((void *)0x0,sVar11,3,1,handle->fd,handle->section_header_size);
          handle->interface_description = piVar8;
          if ((!bVar16) &&
             (PVar13 = PCAPNG_MMAP_FAILED,
             piVar8 != (interface_description_block *)0xffffffffffffffff)) {
            padopt.option_length =
                 ((short)(int)handle->section_header_size -
                 (short)handle->next_section_option_offset) - 0xc;
            *(option_header *)
             ((long)&handle->section_header->block_type + handle->next_section_option_offset) =
                 padopt;
            psVar7 = handle->section_header;
            uVar10 = handle->section_header_size;
            uVar9 = (uint32_t)uVar10;
            psVar7->block_total_length = uVar9;
            *(uint32_t *)((long)psVar7 + ((uVar10 & 0xfffffffffffffffc) - 4)) = uVar9;
            padopt.option_length =
                 ((short)(int)handle->interface_description_size -
                 (short)handle->next_interface_option_offset) - 0xc;
            *(option_header *)
             ((long)&handle->interface_description->block_type +
             handle->next_interface_option_offset) = padopt;
            piVar8 = handle->interface_description;
            uVar10 = handle->interface_description_size;
            piVar8->block_total_length = (uint32_t)uVar10;
            *(uint32_t *)((long)piVar8 + ((uVar10 & 0xfffffffffffffffc) - 4)) = (uint32_t)uVar10;
            handle->section_header->section_length = uVar10;
            return PCAPNG_OK;
          }
        }
        goto LAB_00108087;
      }
      do {
        if (interface_options->option_code == 0) {
LAB_001080a1:
          sVar6 = handle->interface_description_size;
          handle->next_interface_option_offset = sVar6;
          goto LAB_001080af;
        }
        uVar2 = interface_options->option_length;
        if (uVar2 == 0) goto LAB_001080a1;
        uVar10 = (ulong)(uVar2 + 3 & 0xfffffffc);
        lVar15 = write(handle->fd,interface_options,(ulong)uVar2 + 4);
        if (lVar15 != -1 && uVar10 != uVar2) {
          lVar14 = uVar2 - uVar10;
          do {
            lVar14 = lVar14 + 1;
            lVar15 = write(handle->fd,"",1);
            if (lVar14 == 0) break;
          } while (lVar15 != -1);
        }
        interface_options = (option_header *)((long)&interface_options[1].option_code + uVar10);
        handle->interface_description_size = handle->interface_description_size + uVar10 + 4;
      } while (lVar15 != -1);
      handle->next_interface_option_offset = handle->interface_description_size;
    }
  }
LAB_00108081:
  PVar13 = PCAPNG_FILE_WRITE_ERROR;
LAB_00108087:
  pcapng_close(handle);
  return PVar13;
}

Assistant:

PCAPNG_RESULT pcapng_create( PCAPNG_HANDLE * handle,
			     const char * filename,
			     const option_header * section_options,
			     const size_t section_options_space,
			     const uint16_t link_type,
			     const uint32_t snaplen,
			     const option_header * interface_options,
			     const size_t interface_options_space )
{
	PCAPNG_RESULT retval = PCAPNG_OK;
	int PGSZ = getpagesize( );
	size_t zeroes = 0, result = -1;

	handle->section_header = NULL;
	handle->interface_description = NULL;
	handle->section_header_size = handle->next_section_option_offset =
		handle->interface_description_size =
		handle->next_interface_option_offset = 0;

	handle->fd = open( filename, O_RDWR|O_CREAT|O_EXCL, S_IRUSR|S_IWUSR|S_IRGRP|S_IWGRP );
	if (handle->fd == -1) {
		switch( errno ) {
		case EEXIST:
			retval = PCAPNG_FILE_EXISTS;
			break;
		case EMFILE:
		case ENFILE:
			retval = PCAPNG_TOO_MANY_FILES_OPEN;
			break;
		case ENOMEM:
		case ENOSPC:
			retval = PCAPNG_NO_MEMORY;
			break;
		default:
			retval = PCAPNG_FILE_NOT_ALLOWED;
		}
	}

	if (retval == PCAPNG_OK) {
		/* section header */
		const section_header_block shb = {
			.block_type = BLOCK_TYPE_SECTION_HEADER,
			.block_total_length = 28,
			.byte_order_magic = SECTION_HEADER_BYTE_ORDER_MAGIC,
			.major_version = 1,
			.minor_version = 0,
			.section_length = (uint64_t) -1,
		};
		handle->section_header_size = sizeof( shb );
		result = write( handle->fd, &shb, sizeof( shb ) );
		/* write initial section options */
		while ((result != -1) &&
		       section_options &&
		       section_options->option_code &&
		       section_options->option_length) {
			size_t paddedsz = 4*((section_options->option_length+3)/4);
			zeroes = paddedsz - section_options->option_length;
			result = write( handle->fd, section_options, 4+section_options->option_length );
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}
			section_options = (const option_header *) &((uint8_t *)section_options)[4+paddedsz];
			handle->section_header_size += (4+paddedsz);
		}
		handle->next_section_option_offset = handle->section_header_size;
	}

	if (result == -1) {
		retval = PCAPNG_FILE_WRITE_ERROR;
	}
	else {
		/* determine the size of section header with desired space */
		zeroes = (size_t) PGSZ*((handle->section_header_size + 4 +
					 section_options_space + PGSZ - 1)/PGSZ) -
			handle->section_header_size;
		handle->section_header_size += zeroes;
		while ((zeroes > 0) && (result != -1)) {
			result = write( handle->fd, "\0", 1 );
			zeroes--;
		}

		/* mmap the section header */
		handle->section_header = mmap( NULL, handle->section_header_size, 
					       PROT_READ|PROT_WRITE,
					       MAP_SHARED,
					       handle->fd, 0 );
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->section_header == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			/* write the interface header */
			const interface_description_block idb = {
				.block_type = BLOCK_TYPE_INTERFACE,
				.block_total_length = 0,
				.link_type = link_type,
				.snaplen = snaplen
			};
			handle->interface_description_size = sizeof( idb );
			result = write( handle->fd, &idb, sizeof( idb ) );

			/* write interface options */
			while ((result != -1) &&
			       interface_options &&
			       interface_options->option_code &&
			       interface_options->option_length) {
				size_t paddedsz = 4*((interface_options->option_length+3)/4);
				zeroes = paddedsz - interface_options->option_length;
				result = write( handle->fd, interface_options, 4+interface_options->option_length );
				while ((zeroes > 0) && (result != -1)) {
					result = write( handle->fd, "\0", 1 );
					zeroes--;
				}
				interface_options = (const option_header *) &((uint8_t *)interface_options)[4+paddedsz];
				handle->interface_description_size += (4+paddedsz);
			}
			handle->next_interface_option_offset = handle->interface_description_size;
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else {
			/* determine the size of interface description with desired space */
			zeroes = (size_t) PGSZ*((handle->interface_description_size + 4 +
						 interface_options_space + PGSZ - 1)/PGSZ) -
				handle->interface_description_size;
			handle->interface_description_size += zeroes;
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}

			/* mmap the interface description */
			handle->interface_description = mmap( NULL, handle->interface_description_size, 
							      PROT_READ|PROT_WRITE,
							      MAP_SHARED,
							      handle->fd,
							      handle->section_header_size );
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->interface_description == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			uint8_t * dest = &((uint8_t *)handle->section_header)[handle->next_section_option_offset];
			padopt.option_length = handle->section_header_size -
				handle->next_section_option_offset - 12;

			/* Add padding options, update the header sizes. */
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->section_header->block_total_length =
				(uint32_t) handle->section_header_size;
			((uint32_t*)handle->section_header)[handle->section_header_size/4-1] =
				(uint32_t) handle->section_header_size;

			padopt.option_length = handle->interface_description_size -
				handle->next_interface_option_offset - 12;
			dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->interface_description->block_total_length =
				(uint32_t) handle->interface_description_size;
			((uint32_t*)handle->interface_description)[handle->interface_description_size/4-1] =
				(uint32_t) handle->interface_description_size;

			handle->section_header->section_length = (uint64_t) handle->interface_description_size;
		}
	}

	if (retval != PCAPNG_OK) {
		(void) pcapng_close( handle );
	}

	return retval;
}